

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetProperty_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info,bool isInit)

{
  code *pcVar1;
  DynamicObject *pDVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  bool isForce;
  DictionaryPropertyDescriptor<int> *pDStack_58;
  bool throwIfNotExtensible;
  DictionaryPropertyDescriptor<int> *descriptor;
  ScriptContext *scriptContext;
  PropertyValueInfo *pPStack_40;
  bool isInit_local;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  scriptContext._7_1_ = isInit;
  pPStack_40 = info;
  info_local._4_4_ = flags;
  pvStack_30 = value;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  descriptor = (DictionaryPropertyDescriptor<int> *)
               RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  propertyRecord._7_1_ =
       (info_local._4_4_ & (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
       PropertyOperation_None;
  propertyRecord._6_1_ = (info_local._4_4_ & PropertyOperation_Force) != PropertyOperation_None;
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache
            (value_local._4_4_,(ScriptContext *)descriptor);
  if (value_local._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34d,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_68 = ScriptContext::GetPropertyName((ScriptContext *)descriptor,value_local._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,&local_68,&stack0xffffffffffffffa8);
  if (bVar3) {
    bVar3 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(pDStack_58);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x352,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((pDStack_58->Attributes & 8) == 0) {
      bVar3 = DictionaryPropertyDescriptor<int>::HasNonLetConstGlobal(pDStack_58);
      if ((bVar3) && ((pDStack_58->Attributes & 4) == 0)) {
        if ((propertyRecord._6_1_ & 1) == 0) {
          JavascriptError::ThrowCantAssignIfStrictMode(info_local._4_4_,(ScriptContext *)descriptor)
          ;
        }
        PropertyValueInfo::SetNoCache(pPStack_40,&pDStack_20->super_RecyclableObject);
        return 0;
      }
      if (((scriptContext._7_1_ & 1) != 0) &&
         (bVar3 = DictionaryPropertyDescriptor<int>::GetIsAccessor(pDStack_58), bVar3)) {
        DictionaryPropertyDescriptor<int>::ConvertToData(pDStack_58);
      }
    }
    else {
      if (((propertyRecord._6_1_ & 1) == 0) &&
         (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                            (&this->super_DynamicTypeHandler,(ScriptContext *)descriptor,
                             (bool)(propertyRecord._7_1_ & 1)), !bVar3)) {
        return 0;
      }
      ScriptContext::InvalidateProtoCaches((ScriptContext *)descriptor,value_local._4_4_);
      if ((pDStack_58->Attributes & 0x10) == 0) {
        pDStack_58->Attributes = '\a';
      }
      else {
        pDStack_58->Attributes = pDStack_58->Attributes & 0xd0 | 7;
      }
      DynamicObject::SetHasNoEnumerableProperties(pDStack_20,false);
      DictionaryPropertyDescriptor<int>::ConvertToData(pDStack_58);
    }
    SetPropertyWithDescriptor<false>
              (this,pDStack_20,local_68,&stack0xffffffffffffffa8,pvStack_30,info_local._4_4_,
               pPStack_40);
    this_local._4_4_ = 1;
  }
  else {
    bVar3 = PropertyRecord::IsNumeric(local_68);
    pDVar2 = pDStack_20;
    if (bVar3) {
      uVar4 = PropertyRecord::GetNumericValue(local_68);
      this_local._4_4_ =
           (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2d])
                     (this,pDVar2,(ulong)uVar4,pvStack_30,(ulong)info_local._4_4_);
    }
    else {
      this_local._4_4_ =
           AddProperty(this,pDStack_20,local_68,pvStack_30,'\a',pPStack_40,info_local._4_4_,
                       (bool)(propertyRecord._7_1_ & 1),SideEffects_Any);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, bool isInit)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
        bool isForce = (flags & PropertyOperation_Force) != 0;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return false;
                    }
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
                instance->SetHasNoEnumerableProperties(false);
                descriptor->ConvertToData();
            }
            else if (!allowLetConstGlobal && descriptor->HasNonLetConstGlobal() && !(descriptor->Attributes & PropertyWritable))
            {
                if (!isForce)
                {
                    JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
                }

                // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
                // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads.  This
                // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
                // the local cache (that would be illegal), but still populate the type's property cache.
                PropertyValueInfo::SetNoCache(info, instance);
                return false;
            }
            else if (isInit && descriptor->GetIsAccessor())
            {
                descriptor->ConvertToData();
            }
            SetPropertyWithDescriptor<allowLetConstGlobal>(instance, propertyRecord, &descriptor, value, flags, info);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }
        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, throwIfNotExtensible, SideEffects_Any);
        }